

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstarCluster.cpp
# Opt level: O2

bool __thiscall
GMAA_MAAstarCluster::ConstructAndValuateNextPolicies
          (GMAA_MAAstarCluster *this,PartialPolicyPoolItemInterface_sharedPtr *ppi,
          PartialPolicyPoolInterface_sharedPtr *poolOfNextPolicies,bool *cleanUpPPI)

{
  int *piVar1;
  size_t *psVar2;
  string *__lhs;
  GeneralizedMAAStarPlanner *pGVar3;
  sp_counted_base *psVar4;
  QFunctionJAOHInterface *q;
  BGIP_IncrementalSolverCreatorInterface_T<JointPolicyPureVectorForClusteredBG> *pBVar5;
  element_type *peVar6;
  DecPOMDPDiscreteInterface *pDVar7;
  element_type *peVar8;
  undefined1 auVar9 [16];
  element_type *peVar10;
  element_type *peVar11;
  char cVar12;
  bool bVar13;
  ulong uVar14;
  ostream *poVar15;
  E *pEVar16;
  reference this_00;
  size_t sVar17;
  BayesianGameWithClusterInfo *this_01;
  BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG> *p;
  ulong uVar18;
  int iVar19;
  double dVar20;
  double extraout_XMM0_Qa;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  BGwCI_constPtr bg_ts;
  BGwCI_sharedPtr newBG;
  PJPDP_sharedPtr pP;
  shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_> bgips;
  shared_ptr<JointPolicyDiscretePure> bgpol_jpdp;
  JPPVfCBG_sharedPtr pJPolBG;
  shared_ptr<BayesianGameIdenticalPayoffSolver> bgipsNonIncremental;
  JPPVfCBG_sharedPtr jpolBGcopy;
  undefined1 local_410 [8];
  shared_count local_408;
  double val;
  JPPVfCBG_constPtr local_3f8;
  stringstream ss_2;
  shared_count sStack_3e0;
  ostream local_3d8 [376];
  stringstream ss;
  undefined4 uStack_25c;
  shared_count local_258;
  ostream local_250 [376];
  JointPolicyPureVectorForClusteredBG bestLBjpolBG;
  undefined1 extraout_var [56];
  
  (*ppi->px->_vptr_PartialPolicyPoolItemInterface[2])(&pP);
  sVar17 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
           super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
           _m_horizon;
  uVar14 = ((pP.px)->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
           _m_depth;
  bg_ts.px = (element_type *)0x0;
  bg_ts.pn.pi_ = (sp_counted_base *)0x0;
  bgips.px = (element_type *)0x0;
  bgips.pn.pi_ = (sp_counted_base *)0x0;
  bgipsNonIncremental.px = (element_type *)0x0;
  bgipsNonIncremental.pn.pi_ = (sp_counted_base *)0x0;
  pJPolBG.px = (element_type *)0x0;
  pJPolBG.pn.pi_ = (sp_counted_base *)0x0;
  (*ppi->px->_vptr_PartialPolicyPoolItemInterface[5])(&ss);
  peVar10 = _ss;
  iVar19 = (int)uVar14;
  uVar14 = uVar14 & 0xffffffff;
  uVar18 = sVar17 - 1;
  boost::detail::shared_count::~shared_count(&local_258);
  if (peVar10 == (element_type *)0x0) {
    if (7 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
            super_GeneralizedMAAStarPlanner._m_verboseness) {
      poVar15 = std::operator<<((ostream *)&std::cout,
                                "GMAA_MAAstarCluster: I have not expanded this ppi before...");
      std::endl<char,std::char_traits<char>>(poVar15);
    }
    psVar2 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
              super_GeneralizedMAAStarPlanner._m_bgCounter;
    *psVar2 = *psVar2 + 1;
    if (iVar19 == 0) {
      boost::make_shared<PartialJointPolicyPureVector,PartialJointPolicyDiscretePure&>
                ((boost *)&ss,pP.px);
      boost::shared_ptr<PartialJointPolicyDiscretePure>::operator=
                (&pP,(shared_ptr<PartialJointPolicyPureVector> *)&ss);
      this_01 = (BayesianGameWithClusterInfo *)operator_new(0x1c8);
      q = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete)._m_qHeuristic;
      bestLBjpolBG.super_PartialJointPolicyPureVector.super_PartialJointPolicyDiscretePure.
      super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy =
           (_func_int **)pP.px;
      bestLBjpolBG.super_PartialJointPolicyPureVector.super_PartialJointPolicyDiscretePure.
      super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._m_depth =
           (size_t)pP.pn.pi_;
      if (pP.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (pP.pn.pi_)->use_count_ = (pP.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      BayesianGameWithClusterInfo::BayesianGameWithClusterInfo
                (this_01,(PlanningUnitDecPOMDPDiscrete *)this,q,
                 (shared_ptr<const_PartialJointPolicyDiscretePure> *)&bestLBjpolBG,Lossless);
      boost::shared_ptr<BayesianGameWithClusterInfo>::shared_ptr<BayesianGameWithClusterInfo>
                ((shared_ptr<BayesianGameWithClusterInfo> *)&ss_2,this_01);
      boost::shared_ptr<BayesianGameWithClusterInfo_const>::operator=
                ((shared_ptr<BayesianGameWithClusterInfo_const> *)&bg_ts,
                 (shared_ptr<BayesianGameWithClusterInfo> *)&ss_2);
      boost::detail::shared_count::~shared_count(&sStack_3e0);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &bestLBjpolBG.super_PartialJointPolicyPureVector.
                  super_PartialJointPolicyDiscretePure.super_JointPolicyDiscretePure.
                  super_JointPolicyDiscrete.super_JointPolicy._m_depth);
      boost::detail::shared_count::~shared_count(&local_258);
    }
    else {
      boost::
      dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,PartialJointPolicyDiscretePure>
                ((boost *)&ss,&pP);
      boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator=
                (&pJPolBG,(shared_ptr<JointPolicyPureVectorForClusteredBG> *)&ss);
      boost::detail::shared_count::~shared_count(&local_258);
      if (pJPolBG.px == (element_type *)0x0) {
        pEVar16 = (E *)__cxa_allocate_exception(0x28);
        E::E(pEVar16,"GMAA_MAAstarCluster::ConstructAndValuateNextPolicies - dynamic cast failed!");
        goto LAB_0043c146;
      }
      boost::make_shared<JointPolicyPureVectorForClusteredBG,JointPolicyPureVectorForClusteredBG&>
                ((boost *)&bestLBjpolBG,pJPolBG.px);
      boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator=
                (&pJPolBG,(shared_ptr<JointPolicyPureVectorForClusteredBG> *)&bestLBjpolBG);
      bgpol_jpdp.px = (element_type *)((pJPolBG.px)->_m_bg).px;
      bgpol_jpdp.pn.pi_ = ((pJPolBG.px)->_m_bg).pn.pi_;
      psVar4 = ((pJPolBG.px)->_m_bg).pn.pi_;
      if (psVar4 != (sp_counted_base *)0x0) {
        LOCK();
        piVar1 = &psVar4->use_count_;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      BayesianGameWithClusterInfo::ConstructExtendedBGWCI
                ((BayesianGameWithClusterInfo *)&newBG,(BGwCI_constPtr *)&bgpol_jpdp,
                 (JointPolicyDiscretePure *)pJPolBG.px,
                 (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete)._m_qHeuristic);
      __lhs = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
               super_GeneralizedMAAStarPlanner._m_bgBaseFilename;
      bVar13 = std::operator!=(__lhs,"");
      if (bVar13) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar15 = std::operator<<(local_250,(string *)__lhs);
        poVar15 = std::operator<<(poVar15,"beforeCluster");
        *(undefined8 *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x10) = 6;
        poVar15 = std::operator<<(poVar15,0x30);
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
        poVar15 = std::operator<<(poVar15,"_ts");
        *(undefined8 *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x10) = 3;
        poVar15 = std::operator<<(poVar15,0x30);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
        peVar11 = newBG.px;
        std::__cxx11::stringbuf::str();
        BayesianGameIdenticalPayoff::Save
                  (&(peVar11->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff,
                   (string *)&ss_2);
        std::__cxx11::string::~string((string *)&ss_2);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar15 = std::operator<<(local_250,"GMAA_MAAstarCluster::BGCluster_ts");
      *(undefined8 *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x10) = 3;
      poVar15 = std::operator<<(poVar15,0x30);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      std::__cxx11::stringbuf::str();
      pGVar3 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                super_GeneralizedMAAStarPlanner;
      TimedAlgorithm::StartTimer(&pGVar3->super_TimedAlgorithm,(string *)&ss_2);
      std::__cxx11::string::~string((string *)&ss_2);
      BayesianGameWithClusterInfo::Cluster((BayesianGameWithClusterInfo *)&ss_2);
      boost::shared_ptr<BayesianGameWithClusterInfo_const>::operator=
                ((shared_ptr<BayesianGameWithClusterInfo_const> *)&bg_ts,
                 (shared_ptr<BayesianGameWithClusterInfo> *)&ss_2);
      boost::detail::shared_count::~shared_count(&sStack_3e0);
      std::__cxx11::stringbuf::str();
      TimedAlgorithm::StopTimer(&pGVar3->super_TimedAlgorithm,(string *)&ss_2);
      std::__cxx11::string::~string((string *)&ss_2);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      this_00 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::at(&this->_m_clusteredBGsizes,
                     (ulong)((bg_ts.px)->super_BayesianGameForDecPOMDPStage).
                            super_BayesianGameForDecPOMDPStageInterface._m_t);
      sVar17 = BayesianGameBase::GetNrJointTypes
                         ((BayesianGameBase *)
                          &((bg_ts.px)->super_BayesianGameForDecPOMDPStage).
                           super_BayesianGameIdenticalPayoff);
      _ss = (element_type *)CONCAT44(uStack_25c,(int)sVar17);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&ss);
      bVar13 = std::operator!=(&this->_m_clusterStatsFilename,"");
      if (bVar13) {
        SaveClusterStats(this,&this->_m_clusterStatsFilename);
      }
      bVar13 = std::operator!=(__lhs,"");
      if (bVar13) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar15 = std::operator<<(local_250,(string *)__lhs);
        poVar15 = std::operator<<(poVar15,"afterCluster");
        *(undefined8 *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x10) = 6;
        poVar15 = std::operator<<(poVar15,0x30);
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
        poVar15 = std::operator<<(poVar15,"_ts");
        *(undefined8 *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x10) = 3;
        poVar15 = std::operator<<(poVar15,0x30);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
        peVar10 = bg_ts.px;
        std::__cxx11::stringbuf::str();
        BayesianGameIdenticalPayoff::Save
                  (&(peVar10->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff,
                   (string *)&ss_2);
        std::__cxx11::string::~string((string *)&ss_2);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      }
      boost::detail::shared_count::~shared_count(&newBG.pn);
      boost::detail::shared_count::~shared_count(&bgpol_jpdp.pn);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &bestLBjpolBG.super_PartialJointPolicyPureVector.
                  super_PartialJointPolicyDiscretePure.super_JointPolicyDiscretePure.
                  super_JointPolicyDiscrete.super_JointPolicy._m_depth);
    }
    pBVar5 = this->_m_newBGIP_Solver;
    _ss_2 = (pointer)&((bg_ts.px)->super_BayesianGameForDecPOMDPStage).
                      super_BayesianGameIdenticalPayoff;
    if (bg_ts.px == (element_type *)0x0) {
      _ss_2 = (pointer)0x0;
    }
    sStack_3e0.pi_ = bg_ts.pn.pi_;
    if (bg_ts.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (bg_ts.pn.pi_)->use_count_ = (bg_ts.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    p = (BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG> *)
        (**(code **)(*(long *)pBVar5 + 0x10))(pBVar5,&ss_2);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::
    shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>>
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)&ss,p);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::operator=
              (&bgipsNonIncremental,(shared_ptr<BayesianGameIdenticalPayoffSolver> *)&ss);
    boost::detail::shared_count::~shared_count(&local_258);
    boost::detail::shared_count::~shared_count(&sStack_3e0);
    boost::
    dynamic_pointer_cast<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>,BayesianGameIdenticalPayoffSolver>
              ((boost *)&ss,&bgipsNonIncremental);
    boost::shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>::
    operator=(&bgips,(shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>
                      *)&ss);
    boost::detail::shared_count::~shared_count(&local_258);
    if (bgips.px != (element_type *)0x0) {
      if (uVar14 == uVar18) {
        BGIPSolution::SetNrDesiredSolutions((BGIPSolution *)(bgips.px + 0x18),1);
      }
      else if (*(long *)(bgips.px + 0x30) != 0x7fffffff) {
        pEVar16 = (E *)__cxa_allocate_exception(0x28);
        E::E(pEVar16,"GMAA_MAAstar requires a BGIP solver to return all solutions (when requested)")
        ;
        goto LAB_0043c146;
      }
      peVar6 = ppi->px;
      _ss = (element_type *)bgips.px;
      local_258.pi_ = bgips.pn.pi_;
      if (bgips.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (bgips.pn.pi_)->use_count_ = (bgips.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      (*peVar6->_vptr_PartialPolicyPoolItemInterface[7])(peVar6,&ss);
      boost::detail::shared_count::~shared_count(&local_258);
LAB_0043bb49:
      if (1 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
              super_GeneralizedMAAStarPlanner._m_verboseness) {
        poVar15 = std::operator<<((ostream *)&std::cout,"About to solve the following BG:");
        std::endl<char,std::char_traits<char>>(poVar15);
        (*((bg_ts.px)->super_BayesianGameForDecPOMDPStage).
          super_BayesianGameForDecPOMDPStageInterface._vptr_BayesianGameForDecPOMDPStageInterface[6]
        )(&ss);
        poVar15 = std::operator<<((ostream *)&std::cout,(string *)&ss);
        std::endl<char,std::char_traits<char>>(poVar15);
        std::__cxx11::string::~string((string *)&ss);
      }
      dVar20 = ((pP.px)->super_PartialJointPolicy)._m_pastReward;
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar15 = std::operator<<(local_250,"GMAA_MAAstarCluster::NextExact_ts");
      *(undefined8 *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x10) = 3;
      poVar15 = std::operator<<(poVar15,0x30);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      std::__cxx11::stringbuf::str();
      pGVar3 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                super_GeneralizedMAAStarPlanner;
      TimedAlgorithm::StartTimer(&pGVar3->super_TimedAlgorithm,(string *)&ss_2);
      std::__cxx11::string::~string((string *)&ss_2);
      GeneralizedMAAStarPlannerForDecPOMDPDiscrete::SetCBGbounds
                (&this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete,ppi,&bgipsNonIncremental)
      ;
      _ss_2 = (pointer)&((bg_ts.px)->super_BayesianGameForDecPOMDPStage).
                        super_BayesianGameIdenticalPayoff;
      if (bg_ts.px == (element_type *)0x0) {
        _ss_2 = (pointer)0x0;
      }
      sStack_3e0.pi_ = bg_ts.pn.pi_;
      if (bg_ts.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (bg_ts.pn.pi_)->use_count_ = (bg_ts.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      local_3f8.px = (element_type *)0x0;
      local_3f8.pn.pi_ = (sp_counted_base *)0x0;
      JointPolicyPureVectorForClusteredBG::JointPolicyPureVectorForClusteredBG
                (&bestLBjpolBG,(shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)&ss_2,
                 TYPE_INDEX,&local_3f8,0.0);
      boost::detail::shared_count::~shared_count(&local_3f8.pn);
      boost::detail::shared_count::~shared_count(&sStack_3e0);
      bgpol_jpdp.px = (element_type *)0x0;
      bgpol_jpdp.pn.pi_ = (sp_counted_base *)0x0;
      *(long *)(bgips.px + 0x108) = *(long *)(bgips.px + 0x108) + 1;
      cVar12 = (**(code **)(*(long *)bgips.px + 0x50))(bgips.px,&bgpol_jpdp,&val);
      if (cVar12 == '\0') {
        if (0 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                super_GeneralizedMAAStarPlanner._m_verboseness) {
          poVar15 = std::operator<<((ostream *)&std::cout,
                                    "GMAA_MAAstar no valid solution returned by the Incremental BGIP Solver"
                                   );
          std::endl<char,std::char_traits<char>>(poVar15);
        }
        (*ppi->px->_vptr_PartialPolicyPoolItemInterface[4])(0xffefffffffffffff);
      }
      else {
        dVar21 = extraout_XMM0_Qa;
        boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,JointPolicyDiscretePure>
                  ((boost *)&newBG,&bgpol_jpdp);
        if (newBG.px == (element_type *)0x0) {
          pEVar16 = (E *)__cxa_allocate_exception(0x28);
          E::E(pEVar16,
               "GMAA_MAAstarCluster: did not get a valid policy from the incremental BGIP solver");
          __cxa_throw(pEVar16,&E::typeinfo,E::~E);
        }
        _ss_2 = (pointer)newBG.px;
        sStack_3e0.pi_ = newBG.pn.pi_;
        if (newBG.pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (newBG.pn.pi_)->use_count_ = (newBG.pn.pi_)->use_count_ + 1;
          UNLOCK();
        }
        (*((bg_ts.px)->super_BayesianGameForDecPOMDPStage).
          super_BayesianGameForDecPOMDPStageInterface._vptr_BayesianGameForDecPOMDPStageInterface[5]
        )(bg_ts.px,&ss_2,0);
        boost::detail::shared_count::~shared_count(&sStack_3e0);
        _ss_2 = (pointer)newBG.px;
        sStack_3e0.pi_ = newBG.pn.pi_;
        if (newBG.pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (newBG.pn.pi_)->use_count_ = (newBG.pn.pi_)->use_count_ + 1;
          UNLOCK();
        }
        boost::make_shared<JointPolicyPureVectorForClusteredBG,JointPolicyPureVectorForClusteredBG&>
                  ((boost *)&jpolBGcopy,(JointPolicyPureVectorForClusteredBG *)newBG.px);
        boost::detail::shared_count::~shared_count(&sStack_3e0);
        (*((jpolBGcopy.px)->super_PartialJointPolicyPureVector).super_PartialJointPolicyDiscretePure
          .super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy.
          _vptr_JointPolicy[2])(jpolBGcopy.px,(ulong)(iVar19 + 1));
        pDVar7 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                 super_PlanningUnitDecPOMDPDiscrete._m_DecPOMDP;
        auVar24 = (**(code **)(*(long *)((long)&pDVar7->field_0x0 +
                                        *(long *)(*(long *)pDVar7 + -0xb0)) + 0x70))
                            ((long)&pDVar7->field_0x0 + *(long *)(*(long *)pDVar7 + -0xb0));
        auVar23._0_8_ = auVar24._8_8_;
        auVar23._8_56_ = extraout_var;
        auVar9 = vcvtusi2sd_avx512f(auVar23._0_16_,iVar19);
        dVar22 = pow(auVar24._0_8_,auVar9._0_8_);
        dVar21 = dVar20 + dVar21;
        ((jpolBGcopy.px)->super_PartialJointPolicyPureVector).super_PartialJointPolicyDiscretePure.
        super_PartialJointPolicy._m_pastReward = dVar21;
        peVar8 = poolOfNextPolicies->px;
        _ss_2 = (pointer)jpolBGcopy.px;
        dVar20 = (double)((ulong)(uVar14 == uVar18) * (long)dVar21 +
                         (ulong)(uVar14 != uVar18) * (long)(dVar20 + dVar22 * val));
        sStack_3e0.pi_ = jpolBGcopy.pn.pi_;
        if (jpolBGcopy.pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (jpolBGcopy.pn.pi_)->use_count_ = (jpolBGcopy.pn.pi_)->use_count_ + 1;
          UNLOCK();
        }
        dVar21 = dVar20;
        (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
          super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
          _vptr_PlanningUnit[0x16])(local_410,this,&ss_2);
        (*peVar8->_vptr_PartialPolicyPoolInterface[8])(peVar8,local_410);
        boost::detail::shared_count::~shared_count(&local_408);
        boost::detail::shared_count::~shared_count(&sStack_3e0);
        if (iVar19 != 0) {
          (*ppi->px->_vptr_PartialPolicyPoolItemInterface[3])();
          (*ppi->px->_vptr_PartialPolicyPoolItemInterface[4])(dVar20);
          pDVar7 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                   super_PlanningUnitDecPOMDPDiscrete._m_DecPOMDP;
          dVar20 = (double)(**(code **)(*(long *)((long)&pDVar7->field_0x0 +
                                                 *(long *)(*(long *)pDVar7 + -0xb0)) + 0x70))
                                     ((long)&pDVar7->field_0x0 + *(long *)(*(long *)pDVar7 + -0xb0))
          ;
          if ((dVar20 == 1.0) && (!NAN(dVar20))) {
            (*ppi->px->_vptr_PartialPolicyPoolItemInterface[3])();
            if (dVar21 < dVar20) {
              (*ppi->px->_vptr_PartialPolicyPoolItemInterface[3])();
              bVar13 = Globals::EqualReward(dVar21,dVar20);
              if (!bVar13) {
                std::__cxx11::stringstream::stringstream((stringstream *)&ss_2);
                std::operator<<(local_3d8,
                                "GMAA_MAAstarCluster value of parent can only go down when being updated: old value="
                               );
                dVar20 = dVar21;
                poVar15 = std::ostream::_M_insert<double>(dVar21);
                std::operator<<(poVar15," new value=");
                (*ppi->px->_vptr_PartialPolicyPoolItemInterface[3])();
                poVar15 = std::ostream::_M_insert<double>(dVar20);
                std::operator<<(poVar15," old-new=");
                (*ppi->px->_vptr_PartialPolicyPoolItemInterface[3])();
                std::ostream::_M_insert<double>(dVar21 - dVar20);
                pEVar16 = (E *)__cxa_allocate_exception(0x28);
                E::E(pEVar16,&ss_2);
                __cxa_throw(pEVar16,&E::typeinfo,E::~E);
              }
            }
          }
        }
        boost::detail::shared_count::~shared_count(&jpolBGcopy.pn);
        boost::detail::shared_count::~shared_count(&newBG.pn);
      }
      bVar13 = BGIP_IncrementalSolverInterface::AllSolutionsHaveBeenReturned
                         ((BGIP_IncrementalSolverInterface *)bgips.px);
      if (bVar13) {
        bVar13 = true;
        if (3 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                super_GeneralizedMAAStarPlanner._m_verboseness) {
          poVar15 = std::operator<<((ostream *)&std::cout,
                                    ">>>AllSolutionsHaveBeenReturned, removing ");
          (*((pP.px)->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
            _vptr_JointPolicy[6])(&ss_2);
          poVar15 = std::operator<<(poVar15,(string *)&ss_2);
          poVar15 = std::operator<<(poVar15,"<<<");
          std::endl<char,std::char_traits<char>>(poVar15);
          std::__cxx11::string::~string((string *)&ss_2);
        }
      }
      else {
        bVar13 = false;
      }
      *cleanUpPPI = bVar13;
      std::__cxx11::stringbuf::str();
      TimedAlgorithm::StopTimer(&pGVar3->super_TimedAlgorithm,(string *)&ss_2);
      std::__cxx11::string::~string((string *)&ss_2);
      boost::detail::shared_count::~shared_count(&bgpol_jpdp.pn);
      JointPolicyPureVectorForClusteredBG::~JointPolicyPureVectorForClusteredBG(&bestLBjpolBG);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      boost::detail::shared_count::~shared_count(&pJPolBG.pn);
      boost::detail::shared_count::~shared_count(&bgipsNonIncremental.pn);
      boost::detail::shared_count::~shared_count(&bgips.pn);
      boost::detail::shared_count::~shared_count(&bg_ts.pn);
      boost::detail::shared_count::~shared_count(&pP.pn);
      return uVar14 == uVar18;
    }
    pEVar16 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar16,"GMAA_MAAstarCluster requires BGIP_IncrementalSolverInterface_T solvers");
  }
  else {
    if (7 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
            super_GeneralizedMAAStarPlanner._m_verboseness) {
      poVar15 = std::operator<<((ostream *)&std::cout,
                                "GMAA_MAAstarCluster: ppi was expanded before, getting the previous BGIPSolver..."
                               );
      std::endl<char,std::char_traits<char>>(poVar15);
    }
    (*ppi->px->_vptr_PartialPolicyPoolItemInterface[5])(&ss);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::operator=
              (&bgipsNonIncremental,(shared_ptr<BayesianGameIdenticalPayoffSolver> *)&ss);
    boost::detail::shared_count::~shared_count(&local_258);
    boost::
    dynamic_pointer_cast<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>,BayesianGameIdenticalPayoffSolver>
              ((boost *)&ss,&bgipsNonIncremental);
    boost::shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>::
    operator=(&bgips,(shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>
                      *)&ss);
    boost::detail::shared_count::~shared_count(&local_258);
    if (bgips.px == (element_type *)0x0) {
      pEVar16 = (E *)__cxa_allocate_exception(0x28);
      E::E(pEVar16,"GMAA_MAAstarCluster requires BGIP_IncrementalSolverInterface_T solvers");
    }
    else {
      _ss_2 = *(pointer *)(bgips.px + 8);
      sStack_3e0.pi_ = *(sp_counted_base **)(bgips.px + 0x10);
      if (*(long *)(bgips.px + 0x10) != 0) {
        LOCK();
        piVar1 = (int *)(*(long *)(bgips.px + 0x10) + 8);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      boost::
      dynamic_pointer_cast<BayesianGameWithClusterInfo_const,BayesianGameIdenticalPayoffInterface_const>
                ((boost *)&ss,(shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)&ss_2);
      boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=
                (&bg_ts,(shared_ptr<const_BayesianGameWithClusterInfo> *)&ss);
      boost::detail::shared_count::~shared_count(&local_258);
      boost::detail::shared_count::~shared_count(&sStack_3e0);
      if (bg_ts.px != (element_type *)0x0) goto LAB_0043bb49;
      pEVar16 = (E *)__cxa_allocate_exception(0x28);
      E::E(pEVar16,"GMAA_MAAstarCluster BG is not of the correct type");
    }
  }
LAB_0043c146:
  __cxa_throw(pEVar16,&E::typeinfo,E::~E);
}

Assistant:

bool GMAA_MAAstarCluster::ConstructAndValuateNextPolicies(
        const PartialPolicyPoolItemInterface_sharedPtr &ppi,
        const PartialPolicyPoolInterface_sharedPtr &poolOfNextPolicies,
        bool &cleanUpPPI)
{
    PJPDP_sharedPtr pP = ppi->GetJPol();
    Index ts = pP->GetDepth();
    bool is_last_ts = (ts ==  GetHorizon() - 1);

    BGwCI_constPtr bg_ts;
    boost::shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG> > bgips;
    //boost::shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG> > bgipsNonIncremental;
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver> bgipsNonIncremental;

    JPPVfCBG_sharedPtr pJPolBG;

    if(ppi->GetBGIPSolverPointer()==0)
    {
        if(_m_verboseness >= 8) 
            cout << "GMAA_MAAstarCluster: I have not expanded this ppi before..." << endl;

        _m_bgCounter++;
        if(ts == 0)
        {
            //first stage, build BG from scratch.
            //also here we need to store the past policy
            PJPPV_sharedPtr pPcopy = boost::make_shared<PartialJointPolicyPureVector>(*pP);
            pP = pPcopy;

// Apparently make_shared works differently on Ubuntu 11.10, so call shared_ptr directly
//            bg_ts = boost::make_shared<BayesianGameWithClusterInfo>(this, _m_qHeuristic, pP);
            bg_ts = boost::shared_ptr<BayesianGameWithClusterInfo>(new BayesianGameWithClusterInfo(this, _m_qHeuristic, pP));
        }
        else
        {
            pJPolBG = 
                boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG>(pP);
            if(pJPolBG == 0)
                throw E("GMAA_MAAstarCluster::ConstructAndValuateNextPolicies - dynamic cast failed!"); 
            
            //when this function returns, ppi and the policy pointed to will be 
            //deleted by GeneralizedMAAStarPlannerForDecPOMDPDiscrete.
            //However, we need to preserve the past (bg) policy to reconstruct the
            //final policy!
            //As a solution, we make an actual copy here.
            JPPVfCBG_sharedPtr pPcopy = boost::make_shared<JointPolicyPureVectorForClusteredBG>(*pJPolBG);
            pJPolBG = pPcopy;

            BGwCI_constPtr pBG = pJPolBG->GetBG();
            BGwCI_sharedPtr newBG = 
                BayesianGameWithClusterInfo::ConstructExtendedBGWCI(pBG,*pJPolBG, _m_qHeuristic);
            
            if(_m_bgBaseFilename!="")
            {
                stringstream ssBefore;
                ssBefore << _m_bgBaseFilename << "beforeCluster"
                         << setw(6) << setfill('0')
                         << _m_bgCounter << "_ts"
                         << setw(3) << setfill('0') << ts;
                BayesianGameIdenticalPayoff::Save(*newBG,ssBefore.str());
            }

            {
                stringstream ss;
                ss << "GMAA_MAAstarCluster::BGCluster_ts" 
                   << setw(3) << setfill('0') << ts;
                StartTimer(ss.str());
                // do the clustering
                bg_ts = newBG->Cluster();
                StopTimer(ss.str());
            }

            _m_clusteredBGsizes.at(
                bg_ts->GetStage()).push_back(bg_ts->GetNrJointTypes());
            if(_m_clusterStatsFilename!="")
                SaveClusterStats(_m_clusterStatsFilename);
        
            if(_m_bgBaseFilename!="")
            {
                stringstream ssAfter;
                ssAfter << _m_bgBaseFilename << "afterCluster"
                         << setw(6) << setfill('0')
                         << _m_bgCounter << "_ts"
                         << setw(3) << setfill('0') << ts;
                BayesianGameIdenticalPayoff::Save(*bg_ts,ssAfter.str());
            }
        }

        // keep track of every bg_ts we instantiate, so we can clean
        // them up after solving
//        _m_pointersToAllBGTS.push_back(bg_ts);

        // create the BGIPSolver
        // _m_newBGIP_Solver is pointer to a BGSolverCreator, here this functor is called:
        bgipsNonIncremental =
            boost::shared_ptr<BayesianGameIdenticalPayoffSolver >(
                    _m_newBGIP_Solver->operator()(bg_ts) );

        //check if it can be converted to an incremental solver:
        bgips = 
            boost::dynamic_pointer_cast<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG> > (bgipsNonIncremental);

        if(bgips==0)
            throw(E("GMAA_MAAstarCluster requires BGIP_IncrementalSolverInterface_T solvers"));
        if(is_last_ts)
        {
            //For the last stage we only want 1 solution.
            bgips->SetNrDesiredSolutions(1);
        }
        else if(bgips->GetNrDesiredSolutions()!=INT_MAX)
            throw(E("GMAA_MAAstar requires a BGIP solver to return all solutions (when requested)"));

        // associate the resulting incremental BGIPSolver with this
        // PPI, so that we can reuse it
        //ppi->SetBGIPSolver_T_Pointer(bgips);
        ppi->SetBGIPSolverPointer( boost::static_pointer_cast<BayesianGameIdenticalPayoffSolver>(bgips) );
    }
    else // we already have the solver:
    {
        if(_m_verboseness >= 8) 
            cout << "GMAA_MAAstarCluster: ppi was expanded before, getting the previous BGIPSolver..." << endl;

        //bgipsNonIncremental=ppi->GetBGIPSolver_T_PointerCluster();
        bgipsNonIncremental = ppi->GetBGIPSolverPointer();
        bgips = boost::dynamic_pointer_cast<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG> >(bgipsNonIncremental);
        if(bgips == 0)
            throw(E("GMAA_MAAstarCluster requires BGIP_IncrementalSolverInterface_T solvers"));
        bg_ts = boost::dynamic_pointer_cast<const BayesianGameWithClusterInfo>(bgips->GetBGIPI());
        if(bg_ts == 0)
            throw(E("GMAA_MAAstarCluster BG is not of the correct type"));
    }

    if(_m_verboseness >= 2) {
        cout << "About to solve the following BG:"<< endl;
        cout << bg_ts->SoftPrint() << endl;
    }

    double pastReward_prevTs = pP->GetPastReward();

    stringstream ss;
    ss << "GMAA_MAAstarCluster::NextExact_ts" << setw(3) << setfill('0') << ts;
    StartTimer(ss.str());
    
    // Compute bounds on the value solving this CBG can result in
    SetCBGbounds(ppi,bgipsNonIncremental);

    // a copy, which is only used for the last stage
    JointPolicyPureVectorForClusteredBG bestLBjpolBG = 
        JointPolicyPureVectorForClusteredBG(bg_ts);

    // Ask the BGIPSolver for the next solution, which might not exist
    // due to the bounds on the value of the solution
    double val;
    boost::shared_ptr<JointPolicyDiscretePure> bgpol_jpdp;
    /// Calling the BGIPSolver
    bool foundCBGsolution = bgips->GetNextJointPolicyAndValue(bgpol_jpdp, val);

    if(foundCBGsolution)
    {
        JPPVfCBG_sharedPtr bgpol = boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG>(bgpol_jpdp);
        if(bgpol==0)
            throw(E("GMAA_MAAstarCluster: did not get a valid policy from the incremental BGIP solver"));
        double immR = bg_ts->ComputeDiscountedImmediateRewardForJPol(bgpol);
        
        JPPVfCBG_sharedPtr jpolBGcopy = boost::make_shared<JointPolicyPureVectorForClusteredBG>(*boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG>(bgpol));
        jpolBGcopy->SetDepth(ts+1);

        double discountToThePowerT = pow( GetDiscount(), (double)(ts) );
        double discounted_F = discountToThePowerT * val;

        //compute expected immediate reward for this stage
        double newPastreward = pastReward_prevTs + immR;
        jpolBGcopy->SetPastReward(newPastreward);
        
        //push this policy and value on the priority queue
        ////if last stage, if so, we want to return the 
        ////*EXACT* past reward, newPastreward.
        double newValue;
        if(is_last_ts)
            newValue=newPastreward;
        else
            newValue=pastReward_prevTs + discounted_F;

        poolOfNextPolicies->Insert( NewPPI(jpolBGcopy,newValue) );

        if(ts>0)
        {
            double oldValue=ppi->GetValue();
            // now we update the current PPI with the value of the next sibling
            // other option is the value of this child
//        ppi->SetValue(bgips->GetPayoff());
            ppi->SetValue(newValue);//-(1e-10));

            if(GetDiscount()==1.0 &&
               oldValue < ppi->GetValue() &&
               !EqualReward(oldValue, ppi->GetValue()))
            {
                stringstream ss;
                ss << "GMAA_MAAstarCluster value of parent can only go down when being updated: old value="
                   << oldValue << " new value=" << ppi->GetValue()
                   << " old-new=" << oldValue-ppi->GetValue();
                throw(E(ss));
            }
        }
    }
    else // we did NOT get a valid solution from this CBG
    {
        if(_m_verboseness >= 1)
            cout << "GMAA_MAAstar no valid solution returned by the Incremental BGIP Solver"<< endl;

        // as we didn't any solution for the CBG, we know this branch
        // of the tree can never contain the optimal policy, so we set
        // its value very low
        ppi->SetValue(-DBL_MAX);
    }

    // if we returned all solutions from this BG, it has to be deleted
    // from the policy pool
    if(bgips->AllSolutionsHaveBeenReturned())
    {
        if(_m_verboseness >= 4)
            cout << ">>>AllSolutionsHaveBeenReturned, removing " << pP->SoftPrint()
                 << "<<<"<<endl;
        cleanUpPPI=true;
    }
    else
        cleanUpPPI=false;

    StopTimer(ss.str());
    //if we created a BG for the last time step t=h-1 - we have a lowerbound
    return(is_last_ts);
}